

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

BasicBlock * __thiscall
spvtools::opt::Loop::FindLoopPreheader(Loop *this,DominatorAnalysis *dom_analysis)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  IRContext *this_00;
  CFG *this_01;
  Instruction *pIVar3;
  _Rb_tree_color _Var4;
  uint32_t blk_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  BasicBlock *pBVar7;
  BasicBlock *this_02;
  pointer puVar8;
  bool bVar9;
  bool is_preheader;
  vector<unsigned_int,_std::allocator<unsigned_int>_> header_pred;
  char local_79;
  DominatorTreeNode *local_78;
  Loop *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  this_01 = (this_00->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar3 = (this->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  _Var4 = _S_red;
  if (pIVar3->has_result_id_ == true) {
    _Var4 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
  }
  p_Var6 = *(_Base_ptr *)
            ((long)&(dom_analysis->super_DominatorAnalysisBase).tree_.nodes_._M_t._M_impl.
                    super__Rb_tree_header._M_header + 8);
  p_Var1 = &(dom_analysis->super_DominatorAnalysisBase).tree_.nodes_._M_t._M_impl.
            super__Rb_tree_header;
  blk_id = 0;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      bVar9 = p_Var6[1]._M_color < _Var4;
      if (!bVar9) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar9];
    } while (p_Var6 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      local_78 = (DominatorTreeNode *)0x0;
      if (p_Var5[1]._M_color <= _Var4) {
        local_78 = (DominatorTreeNode *)&p_Var5[1]._M_parent;
      }
      goto LAB_00240694;
    }
  }
  local_78 = (DominatorTreeNode *)0x0;
LAB_00240694:
  pIVar3 = (this->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_70 = this;
  if (pIVar3->has_result_id_ == true) {
    blk_id = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
  }
  __x = CFG::preds(this_01,blk_id);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,__x);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar7 = (BasicBlock *)0x0;
    puVar8 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      p_Var6 = *(_Base_ptr *)
                ((long)&(dom_analysis->super_DominatorAnalysisBase).tree_.nodes_._M_t._M_impl.
                        super__Rb_tree_header._M_header + 8);
      this_02 = pBVar7;
      if (p_Var6 != (_Base_ptr)0x0) {
        uVar2 = *puVar8;
        p_Var5 = &p_Var1->_M_header;
        do {
          bVar9 = (uint)*(size_t *)(p_Var6 + 1) < uVar2;
          if (!bVar9) {
            p_Var5 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar9];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           ((uint)((_Rb_tree_header *)p_Var5)->_M_node_count <= uVar2)) {
          bVar9 = DominatorTree::Dominates
                            ((DominatorTree *)dom_analysis,local_78,
                             (DominatorTreeNode *)((long)p_Var5 + 0x28U));
          if ((!bVar9) &&
             (this_02 = *(BasicBlock **)((long)p_Var5 + 0x28U),
             this_02 != pBVar7 && pBVar7 != (BasicBlock *)0x0)) {
            pBVar7 = (BasicBlock *)0x0;
            goto LAB_002407d6;
          }
        }
      }
      puVar8 = puVar8 + 1;
      pBVar7 = this_02;
    } while (puVar8 != local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    if (this_02 != (BasicBlock *)0x0) {
      local_79 = '\x01';
      pIVar3 = (local_70->loop_header_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      local_50._8_4_ = 0;
      if (pIVar3->has_result_id_ == true) {
        local_50._8_4_ = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
      }
      local_50._M_unused._M_object = &local_79;
      local_50._12_4_ = 0;
      local_38 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:252:7)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:252:7)>
                 ::_M_manager;
      BasicBlock::ForEachSuccessorLabel(this_02,(function<void_(unsigned_int)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      pBVar7 = (BasicBlock *)0x0;
      if (local_79 != '\0') {
        pBVar7 = this_02;
      }
LAB_002407d6:
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return pBVar7;
    }
  }
  __assert_fail("loop_pred && \"The header node is the entry block ?\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0xf3,"BasicBlock *spvtools::opt::Loop::FindLoopPreheader(DominatorAnalysis *)");
}

Assistant:

BasicBlock* Loop::FindLoopPreheader(DominatorAnalysis* dom_analysis) {
  CFG* cfg = context_->cfg();
  DominatorTree& dom_tree = dom_analysis->GetDomTree();
  DominatorTreeNode* header_node = dom_tree.GetTreeNode(loop_header_);

  // The loop predecessor.
  BasicBlock* loop_pred = nullptr;

  auto header_pred = cfg->preds(loop_header_->id());
  for (uint32_t p_id : header_pred) {
    DominatorTreeNode* node = dom_tree.GetTreeNode(p_id);
    if (node && !dom_tree.Dominates(header_node, node)) {
      // The predecessor is not part of the loop, so potential loop preheader.
      if (loop_pred && node->bb_ != loop_pred) {
        // If we saw 2 distinct predecessors that are outside the loop, we don't
        // have a loop preheader.
        return nullptr;
      }
      loop_pred = node->bb_;
    }
  }
  // Safe guard against invalid code, SPIR-V spec forbids loop with the entry
  // node as header.
  assert(loop_pred && "The header node is the entry block ?");

  // So we have a unique basic block that can enter this loop.
  // If this loop is the unique successor of this block, then it is a loop
  // preheader.
  bool is_preheader = true;
  uint32_t loop_header_id = loop_header_->id();
  const auto* const_loop_pred = loop_pred;
  const_loop_pred->ForEachSuccessorLabel(
      [&is_preheader, loop_header_id](const uint32_t id) {
        if (id != loop_header_id) is_preheader = false;
      });
  if (is_preheader) return loop_pred;
  return nullptr;
}